

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

ConstantExpr * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::ConstantExpr,LLVMBC::Instruction::GEPOps,LLVMBC::Type*&,std::vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>>>
          (LLVMContext *this,GEPOps *u,Type **u_1,
          vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *u_2)

{
  uint opcode_;
  Type *type;
  vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> local_50;
  ConstantExpr *local_38;
  ConstantExpr *t;
  ConstantExpr *mem;
  vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *u_local_2;
  Type **u_local_1;
  GEPOps *u_local;
  LLVMContext *this_local;
  
  mem = (ConstantExpr *)u_2;
  u_local_2 = (vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *)u_1;
  u_local_1 = (Type **)u;
  u_local = (GEPOps *)this;
  local_38 = (ConstantExpr *)allocate(this,0x58,8);
  t = local_38;
  if (local_38 == (ConstantExpr *)0x0) {
    std::terminate();
  }
  opcode_ = *(uint *)u_local_1;
  type = (Type *)(u_local_2->
                 super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::vector
            (&local_50,
             (vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *)mem);
  ConstantExpr::ConstantExpr(local_38,opcode_,type,&local_50);
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::~vector(&local_50)
  ;
  append_typed_destructor<LLVMBC::ConstantExpr>(this,local_38);
  return local_38;
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}